

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

int process_pass(vw *all,bfgs *b)

{
  size_t sVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  char *__format;
  anon_union_4_2_947300a4 x_1;
  float fVar5;
  undefined4 uVar6;
  double dVar7;
  anon_union_4_2_947300a4 x;
  double dVar8;
  double wolfe1;
  string local_48;
  
  finalize_preconditioner(all,b,all->l2_lambda);
  if (b->first_pass == true) {
    if (all->all_reduce != (AllReduce *)0x0) {
      accumulate(all,&all->weights,3);
      fVar5 = accumulate_scalar(all,(float)b->importance_weight_sum);
      b->importance_weight_sum = (double)fVar5;
      if (all->all_reduce != (AllReduce *)0x0) {
        fVar5 = accumulate_scalar(all,(float)b->loss_sum);
        b->loss_sum = (double)fVar5;
        accumulate(all,&all->weights,1);
      }
    }
    if (0.0 < all->l2_lambda) {
      dVar2 = add_regularization(all,b,all->l2_lambda);
      b->loss_sum = dVar2 + b->loss_sum;
    }
    if (all->quiet == false) {
      fprintf(_stderr,"%2lu %-10.5f\t",SUB84(b->loss_sum / b->importance_weight_sum,0),
              b->current_pass + 1);
    }
    b->previous_loss_sum = b->loss_sum;
    b->loss_sum = 0.0;
    b->example_number = 0;
    b->curvature = 0.0;
    bfgs_iter_start(all,b,b->mem,&b->lastj,b->importance_weight_sum,&b->origin);
    if (b->first_hessian_on == true) {
      b->gradient_pass = false;
    }
    else {
      b->step_size = 0.5;
      fVar5 = direction_magnitude(all);
      ftime(&b->t_end_global);
      b->net_time = (double)(int)((double)((b->t_end_global).time - (b->t_start_global).time) *
                                  1000.0 + (double)(int)((uint)(b->t_end_global).millitm -
                                                        (uint)(b->t_start_global).millitm));
      if (all->quiet == false) {
        fprintf(_stderr,"%-10s\t%-10.5f\t%-.5f\n",SUB84((double)fVar5,0),(double)b->step_size,"");
      }
      v_array<float>::clear(&b->predictions);
      update_weight(all,b->step_size);
    }
  }
  else {
    if (b->gradient_pass != true) {
      if (all->all_reduce != (AllReduce *)0x0) {
        fVar5 = accumulate_scalar(all,(float)b->curvature);
        b->curvature = (double)fVar5;
      }
      if (0.0 < all->l2_lambda) {
        dVar2 = regularizer_direction_magnitude(all,b,all->l2_lambda);
        b->curvature = dVar2 + b->curvature;
      }
      dVar2 = derivative_in_direction(all,b,b->mem,&b->origin);
      fVar5 = (float)dVar2;
      dVar2 = b->curvature;
      if (((dVar2 != 0.0) || (NAN(dVar2))) || ((fVar5 == 0.0 && (!NAN(fVar5))))) {
        if ((fVar5 == 0.0) && (!NAN(fVar5))) {
          fwrite("Derivative 0 detected.\n",0x17,1,_stdout);
          iVar4 = 2;
          goto LAB_0018d248;
        }
        fVar5 = -fVar5 / (float)dVar2;
        iVar4 = 0;
      }
      else {
        fputs(curv_message,_stdout);
        iVar4 = 1;
LAB_0018d248:
        fVar5 = 0.0;
      }
      b->step_size = fVar5;
      fVar5 = direction_magnitude(all);
      v_array<float>::clear(&b->predictions);
      update_weight(all,b->step_size);
      ftime(&b->t_end_global);
      b->net_time = (double)(int)((double)((b->t_end_global).time - (b->t_start_global).time) *
                                  1000.0 + (double)(int)((uint)(b->t_end_global).millitm -
                                                        (uint)(b->t_start_global).millitm));
      if (all->quiet == false) {
        fprintf(_stderr,"%-10.5f\t%-10.5f\t%-.5f\n",SUB84(b->curvature / b->importance_weight_sum,0)
                ,(double)fVar5,SUB84((double)b->step_size,0));
      }
      b->gradient_pass = true;
      goto LAB_0018d2cf;
    }
    if (all->all_reduce != (AllReduce *)0x0) {
      fVar5 = accumulate_scalar(all,(float)b->loss_sum);
      b->loss_sum = (double)fVar5;
      accumulate(all,&all->weights,1);
    }
    if (0.0 < all->l2_lambda) {
      dVar2 = add_regularization(all,b,all->l2_lambda);
      b->loss_sum = dVar2 + b->loss_sum;
    }
    if (all->quiet == false) {
      sVar1 = b->current_pass;
      if (all->holdout_set_off == true) {
        lVar3 = sVar1 + 1;
LAB_0018d6b7:
        uVar6 = SUB84(b->loss_sum / b->importance_weight_sum,0);
        __format = "%2lu %-10.5f\t";
      }
      else {
        if (sVar1 == 0) {
          lVar3 = 1;
          goto LAB_0018d6b7;
        }
        dVar2 = all->sd->weighted_holdout_examples_since_last_pass;
        dVar8 = all->sd->holdout_sum_loss_since_last_pass;
        lVar3 = sVar1 + 1;
        if ((((dVar8 == 0.0) && (!NAN(dVar8))) && (dVar2 == 0.0)) && (!NAN(dVar2))) {
          fprintf(_stderr,"%2lu ",lVar3);
          fwrite("h unknown    ",0xd,1,_stderr);
          goto LAB_0018d043;
        }
        uVar6 = SUB84(dVar8 / dVar2,0);
        __format = "%2lu h%-10.5f\t";
      }
      fprintf(_stderr,__format,uVar6,lVar3);
    }
LAB_0018d043:
    dVar2 = wolfe_eval(all,b,b->mem,b->loss_sum,b->previous_loss_sum,(double)b->step_size,
                       b->importance_weight_sum,&b->origin,&wolfe1);
    if ((~(uint)(float)wolfe1 & 0x7fc00000) == 0) {
      fputc(10,_stderr);
      fwrite("Derivative 0 detected.\n",0x17,1,_stdout);
      b->step_size = 0.0;
      iVar4 = 2;
      goto LAB_0018d2cf;
    }
    if (b->backstep_on == false) {
      dVar7 = b->loss_sum;
      dVar8 = b->previous_loss_sum;
LAB_0018d483:
      dVar8 = (dVar8 - dVar7) / dVar8;
      iVar4 = 0;
      if ((~(uint)(float)dVar8 & 0x7fc00000) != 0 && b->backstep_on == true) {
        if (ABS(dVar8) < (double)b->rel_threshold) {
          fprintf(_stdout,
                  "\nTermination condition reached in pass %ld: decrease in loss less than %.3f%%.\nIf you want to optimize further, decrease termination threshold.\n"
                  ,SUB84((double)b->rel_threshold * 100.0,0),b->current_pass + 1);
          dVar7 = b->loss_sum;
          iVar4 = 2;
        }
      }
      b->previous_loss_sum = dVar7;
      b->loss_sum = 0.0;
      b->example_number = 0;
      b->curvature = 0.0;
      b->step_size = 1.0;
      bfgs_iter_middle(all,b,b->mem,b->rho,b->alpha,&b->lastj,&b->origin);
      if (all->hessian_on == true) {
        b->gradient_pass = false;
      }
      else {
        fVar5 = direction_magnitude(all);
        ftime(&b->t_end_global);
        b->net_time = (double)(int)((double)((b->t_end_global).time - (b->t_start_global).time) *
                                    1000.0 + (double)(int)((uint)(b->t_end_global).millitm -
                                                          (uint)(b->t_start_global).millitm));
        if (all->quiet == false) {
          fprintf(_stderr,"%-10s\t%-10.5f\t%-.5f\n",SUB84((double)fVar5,0),(double)b->step_size,"");
        }
        v_array<float>::clear(&b->predictions);
        update_weight(all,b->step_size);
      }
      goto LAB_0018d2cf;
    }
    if (b->wolfe1_bound <= wolfe1) {
      dVar7 = b->loss_sum;
      dVar8 = b->previous_loss_sum;
      if (dVar7 <= dVar8) goto LAB_0018d483;
    }
    ftime(&b->t_end_global);
    b->net_time = (double)(int)((double)((b->t_end_global).time - (b->t_start_global).time) * 1000.0
                               + (double)(int)((uint)(b->t_end_global).millitm -
                                              (uint)(b->t_start_global).millitm));
    if (all->quiet == false) {
      fVar5 = b->step_size;
      uVar6 = SUB84((double)((float)dVar2 / fVar5),0);
      if ((fVar5 == 0.0) && (!NAN(fVar5))) {
        uVar6 = 0;
      }
      fprintf(_stderr,"%-10s\t%-10s\t(revise x %.1f)\t%-.5f\n",uVar6,dVar2,"");
    }
    v_array<float>::clear(&b->predictions);
    update_weight(all,(float)(dVar2 - (double)b->step_size));
    b->step_size = (float)dVar2;
    zero_derivative(all);
    b->loss_sum = 0.0;
  }
  iVar4 = 0;
LAB_0018d2cf:
  b->current_pass = b->current_pass + 1;
  b->first_pass = false;
  b->preconditioner_pass = false;
  if ((b->output_regularizer == true) && (all->all_reduce != (AllReduce *)0x0)) {
    accumulate(all,&all->weights,3);
  }
  ftime(&b->t_end_global);
  b->net_time = (double)(int)((double)((b->t_end_global).time - (b->t_start_global).time) * 1000.0 +
                             (double)(int)((uint)(b->t_end_global).millitm -
                                          (uint)(b->t_start_global).millitm));
  if (all->save_per_pass == true) {
    std::__cxx11::string::string((string *)&local_48,(string *)&all->final_regressor_name);
    save_predictor(all,&local_48,b->current_pass);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return iVar4;
}

Assistant:

int process_pass(vw& all, bfgs& b)
{
  int status = LEARN_OK;

  finalize_preconditioner(all, b, all.l2_lambda);
  /********************************************************************/
  /* A) FIRST PASS FINISHED: INITIALIZE FIRST LINE SEARCH *************/
  /********************************************************************/
  if (b.first_pass)
  {
    if (all.all_reduce != nullptr)
    {
      accumulate(all, all.weights, W_COND);  // Accumulate preconditioner
      float temp = (float)b.importance_weight_sum;
      b.importance_weight_sum = accumulate_scalar(all, temp);
    }
    // finalize_preconditioner(all, b, all.l2_lambda);
    if (all.all_reduce != nullptr)
    {
      float temp = (float)b.loss_sum;
      b.loss_sum = accumulate_scalar(all, temp);  // Accumulate loss_sums
      accumulate(all, all.weights, 1);            // Accumulate gradients from all nodes
    }
    if (all.l2_lambda > 0.)
      b.loss_sum += add_regularization(all, b, all.l2_lambda);
    if (!all.quiet)
      fprintf(stderr, "%2lu %-10.5f\t", (long unsigned int)b.current_pass + 1, b.loss_sum / b.importance_weight_sum);

    b.previous_loss_sum = b.loss_sum;
    b.loss_sum = 0.;
    b.example_number = 0;
    b.curvature = 0;
    bfgs_iter_start(all, b, b.mem, b.lastj, b.importance_weight_sum, b.origin);
    if (b.first_hessian_on)
    {
      b.gradient_pass = false;  // now start computing curvature
    }
    else
    {
      b.step_size = 0.5;
      float d_mag = direction_magnitude(all);
      ftime(&b.t_end_global);
      b.net_time = (int)(1000.0 * (b.t_end_global.time - b.t_start_global.time) +
          (b.t_end_global.millitm - b.t_start_global.millitm));
      if (!all.quiet)
        fprintf(stderr, "%-10s\t%-10.5f\t%-.5f\n", "", d_mag, b.step_size);
      b.predictions.clear();
      update_weight(all, b.step_size);
    }
  }
  else
      /********************************************************************/
      /* B) GRADIENT CALCULATED *******************************************/
      /********************************************************************/
      if (b.gradient_pass)  // We just finished computing all gradients
  {
    if (all.all_reduce != nullptr)
    {
      float t = (float)b.loss_sum;
      b.loss_sum = accumulate_scalar(all, t);  // Accumulate loss_sums
      accumulate(all, all.weights, 1);         // Accumulate gradients from all nodes
    }
    if (all.l2_lambda > 0.)
      b.loss_sum += add_regularization(all, b, all.l2_lambda);
    if (!all.quiet)
    {
      if (!all.holdout_set_off && b.current_pass >= 1)
      {
        if (all.sd->holdout_sum_loss_since_last_pass == 0. && all.sd->weighted_holdout_examples_since_last_pass == 0.)
        {
          fprintf(stderr, "%2lu ", (long unsigned int)b.current_pass + 1);
          fprintf(stderr, "h unknown    ");
        }
        else
          fprintf(stderr, "%2lu h%-10.5f\t", (long unsigned int)b.current_pass + 1,
              all.sd->holdout_sum_loss_since_last_pass / all.sd->weighted_holdout_examples_since_last_pass);
      }
      else
        fprintf(stderr, "%2lu %-10.5f\t", (long unsigned int)b.current_pass + 1, b.loss_sum / b.importance_weight_sum);
    }
    double wolfe1;
    double new_step = wolfe_eval(
        all, b, b.mem, b.loss_sum, b.previous_loss_sum, b.step_size, b.importance_weight_sum, b.origin, wolfe1);

    /********************************************************************/
    /* B0) DERIVATIVE ZERO: MINIMUM FOUND *******************************/
    /********************************************************************/
    if (nanpattern((float)wolfe1))
    {
      fprintf(stderr, "\n");
      fprintf(stdout, "Derivative 0 detected.\n");
      b.step_size = 0.0;
      status = LEARN_CONV;
    }
    /********************************************************************/
    /* B1) LINE SEARCH FAILED *******************************************/
    /********************************************************************/
    else if (b.backstep_on && (wolfe1 < b.wolfe1_bound || b.loss_sum > b.previous_loss_sum))
    {
      // curvature violated, or we stepped too far last time: step back
      ftime(&b.t_end_global);
      b.net_time = (int)(1000.0 * (b.t_end_global.time - b.t_start_global.time) +
          (b.t_end_global.millitm - b.t_start_global.millitm));
      float ratio = (b.step_size == 0.f) ? 0.f : (float)new_step / (float)b.step_size;
      if (!all.quiet)
        fprintf(stderr, "%-10s\t%-10s\t(revise x %.1f)\t%-.5f\n", "", "", ratio, new_step);
      b.predictions.clear();
      update_weight(all, (float)(-b.step_size + new_step));
      b.step_size = (float)new_step;
      zero_derivative(all);
      b.loss_sum = 0.;
    }

    /********************************************************************/
    /* B2) LINE SEARCH SUCCESSFUL OR DISABLED          ******************/
    /*     DETERMINE NEXT SEARCH DIRECTION             ******************/
    /********************************************************************/
    else
    {
      double rel_decrease = (b.previous_loss_sum - b.loss_sum) / b.previous_loss_sum;
      if (!nanpattern((float)rel_decrease) && b.backstep_on && fabs(rel_decrease) < b.rel_threshold)
      {
        fprintf(stdout,
            "\nTermination condition reached in pass %ld: decrease in loss less than %.3f%%.\n"
            "If you want to optimize further, decrease termination threshold.\n",
            (long int)b.current_pass + 1, b.rel_threshold * 100.0);
        status = LEARN_CONV;
      }
      b.previous_loss_sum = b.loss_sum;
      b.loss_sum = 0.;
      b.example_number = 0;
      b.curvature = 0;
      b.step_size = 1.0;

      try
      {
        bfgs_iter_middle(all, b, b.mem, b.rho, b.alpha, b.lastj, b.origin);
      }
      catch (const curv_exception&)
      {
        fprintf(stdout, "In bfgs_iter_middle: %s", curv_message);
        b.step_size = 0.0;
        status = LEARN_CURV;
      }

      if (all.hessian_on)
      {
        b.gradient_pass = false;  // now start computing curvature
      }
      else
      {
        float d_mag = direction_magnitude(all);
        ftime(&b.t_end_global);
        b.net_time = (int)(1000.0 * (b.t_end_global.time - b.t_start_global.time) +
            (b.t_end_global.millitm - b.t_start_global.millitm));
        if (!all.quiet)
          fprintf(stderr, "%-10s\t%-10.5f\t%-.5f\n", "", d_mag, b.step_size);
        b.predictions.clear();
        update_weight(all, b.step_size);
      }
    }
  }

  /********************************************************************/
  /* C) NOT FIRST PASS, CURVATURE CALCULATED **************************/
  /********************************************************************/
  else  // just finished all second gradients
  {
    if (all.all_reduce != nullptr)
    {
      float t = (float)b.curvature;
      b.curvature = accumulate_scalar(all, t);  // Accumulate curvatures
    }
    if (all.l2_lambda > 0.)
      b.curvature += regularizer_direction_magnitude(all, b, all.l2_lambda);
    float dd = (float)derivative_in_direction(all, b, b.mem, b.origin);
    if (b.curvature == 0. && dd != 0.)
    {
      fprintf(stdout, "%s", curv_message);
      b.step_size = 0.0;
      status = LEARN_CURV;
    }
    else if (dd == 0.)
    {
      fprintf(stdout, "Derivative 0 detected.\n");
      b.step_size = 0.0;
      status = LEARN_CONV;
    }
    else
      b.step_size = -dd / (float)b.curvature;

    float d_mag = direction_magnitude(all);

    b.predictions.clear();
    update_weight(all, b.step_size);
    ftime(&b.t_end_global);
    b.net_time = (int)(1000.0 * (b.t_end_global.time - b.t_start_global.time) +
        (b.t_end_global.millitm - b.t_start_global.millitm));

    if (!all.quiet)
      fprintf(stderr, "%-10.5f\t%-10.5f\t%-.5f\n", b.curvature / b.importance_weight_sum, d_mag, b.step_size);
    b.gradient_pass = true;
  }  // now start computing derivatives.
  b.current_pass++;
  b.first_pass = false;
  b.preconditioner_pass = false;

  if (b.output_regularizer)  // need to accumulate and place the regularizer.
  {
    if (all.all_reduce != nullptr)
      accumulate(all, all.weights, W_COND);  // Accumulate preconditioner
    // preconditioner_to_regularizer(all, b, all.l2_lambda);
  }
  ftime(&b.t_end_global);
  b.net_time = (int)(1000.0 * (b.t_end_global.time - b.t_start_global.time) +
      (b.t_end_global.millitm - b.t_start_global.millitm));

  if (all.save_per_pass)
    save_predictor(all, all.final_regressor_name, b.current_pass);
  return status;
}